

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::shadeFragments
          (FlatColorShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  const_reference pvVar1;
  int local_70;
  int local_6c;
  int fragNdx_2;
  int packetNdx_2;
  int fragNdx_1;
  int packetNdx_1;
  int fragNdx;
  int packetNdx;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 color;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  FlatColorShader *this_local;
  
  pvVar1 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(icolor.m_data + 2),(float (*) [4])&pvVar1->value);
  castVectorSaturate<int>((FboTestUtil *)(uicolor.m_data + 2),(Vec4 *)(icolor.m_data + 2));
  castVectorSaturate<unsigned_int>((FboTestUtil *)&fragNdx,(Vec4 *)(icolor.m_data + 2));
  if (*(int *)&(this->super_ShaderProgram).field_0x154 == 4) {
    for (packetNdx_1 = 0; packetNdx_1 < numPackets; packetNdx_1 = packetNdx_1 + 1) {
      for (fragNdx_1 = 0; fragNdx_1 < 4; fragNdx_1 = fragNdx_1 + 1) {
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,packetNdx_1,fragNdx_1,0,(Vector<float,_4> *)(icolor.m_data + 2));
      }
    }
  }
  else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0x1e) {
    for (packetNdx_2 = 0; packetNdx_2 < numPackets; packetNdx_2 = packetNdx_2 + 1) {
      for (fragNdx_2 = 0; fragNdx_2 < 4; fragNdx_2 = fragNdx_2 + 1) {
        rr::writeFragmentOutput<tcu::Vector<int,4>>
                  (context,packetNdx_2,fragNdx_2,0,(Vector<int,_4> *)(uicolor.m_data + 2));
      }
    }
  }
  else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0x22) {
    for (local_6c = 0; local_6c < numPackets; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
        rr::writeFragmentOutput<tcu::Vector<unsigned_int,4>>
                  (context,local_6c,local_70,0,(Vector<unsigned_int,_4> *)&fragNdx);
      }
    }
  }
  return;
}

Assistant:

void FlatColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4		color	(m_uniforms[0].value.f4);
	const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
	const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

	DE_UNREF(packets);

	if (m_outputType == glu::TYPE_FLOAT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else if (m_outputType == glu::TYPE_INT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
	}
	else if (m_outputType == glu::TYPE_UINT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
	}
	else
		DE_ASSERT(DE_FALSE);
}